

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Dam_ManCreatePairs(Dam_Man_t *p,int fVerbose)

{
  long lVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  size_t __size;
  uint uVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int v;
  int iVar12;
  Vec_Int_t *p_00;
  int *piVar13;
  Hash_IntMan_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar14;
  Hash_IntMan_t *pHVar15;
  Vec_Flt_t *pVVar16;
  float *pfVar17;
  Vec_Que_t *pVVar18;
  Vec_Int_t *pVVar19;
  void *__s;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  double dVar33;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  int local_cc;
  int local_b8;
  int local_b4;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  Dam_ManCollectSets(p);
  pVVar19 = p->pGia->vSuper;
  iVar10 = p->pGia->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar20 = iVar10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar20;
  if (iVar20 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar20 << 2);
  }
  p_00->pArray = piVar13;
  p_01 = Hash_IntManStart(iVar10 / 2);
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 1000;
  p_02->nSize = 0;
  piVar13 = (int *)malloc(4000);
  p_02->pArray = piVar13;
  p_02->nSize = 1000;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,4000);
  }
  Dam_ManCreateMultiRefs(p,&local_50,&local_58);
  pVVar8 = local_50;
  pVVar7 = local_58;
  pGVar14 = p->pGia;
  uVar22 = (ulong)(uint)pGVar14->nObjs;
  if (pGVar14->nObjs < 1) {
    local_cc = 0;
    local_b8 = 0;
    iVar10 = 0;
    local_b4 = 0;
  }
  else {
    lVar32 = 0;
    local_b4 = 0;
    iVar10 = 0;
    local_b8 = 0;
    local_cc = 0;
    do {
      if (pGVar14->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar14->pObjs + lVar32;
      if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
        pVVar5 = p->vNod2Set;
        if ((lVar32 < pVVar5->nSize) && (pVVar5->pArray[lVar32] != 0)) {
          uVar9 = 0;
          if (lVar32 < pVVar5->nSize) {
            uVar9 = pVVar5->pArray[lVar32];
          }
          if (uVar9 == 0) {
            piVar13 = (int *)0x0;
          }
          else {
            if (((int)uVar9 < 0) || (p->vSetStore->nSize <= (int)uVar9)) goto LAB_006fbdcc;
            piVar13 = p->vSetStore->pArray + uVar9;
          }
          iVar20 = *piVar13;
          pVVar19->nSize = 0;
          uVar9 = (uint)*(undefined8 *)pGVar2;
          bVar6 = (~uVar9 & 0x1fffffff) == 0 || (int)uVar9 < 0;
          if (bVar6) goto LAB_006fbe86;
          uVar11 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
          if ((uVar9 & 0x1fffffff) < (uVar11 & 0x1fffffff)) {
            if (0 < *piVar13) {
              lVar30 = 0;
              do {
                uVar9 = piVar13[lVar30 + 1];
                if ((int)uVar9 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (pVVar7->nSize <= (int)(uVar9 >> 1)) goto LAB_006fbdad;
                if (1 < pVVar7->pArray[uVar9 >> 1]) {
                  Vec_IntPush(pVVar19,uVar9);
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 < *piVar13);
            }
          }
          else {
            if ((bVar6) || ((uVar9 & 0x1fffffff) <= (uVar11 & 0x1fffffff))) {
LAB_006fbe86:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                            ,0x280,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
            }
            if ((int)uVar22 <= lVar32) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if ((pGVar14->pMuxes != (uint *)0x0) && (pGVar14->pMuxes[lVar32] != 0))
            goto LAB_006fbe86;
            if (0 < *piVar13) {
              lVar30 = 0;
              do {
                iVar26 = piVar13[lVar30 + 1];
                if (((long)iVar26 < 0) || (pVVar8->nSize <= iVar26)) goto LAB_006fbdad;
                if (1 < pVVar8->pArray[iVar26]) {
                  Vec_IntPush(pVVar19,iVar26);
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 < *piVar13);
            }
          }
          local_cc = local_cc + ((iVar20 + -1) * iVar20) / 2;
          iVar20 = pVVar19->nSize;
          if (1 < iVar20) {
            local_b8 = local_b8 + ((iVar20 + -1) * iVar20) / 2;
            Vec_IntPush(p_00,-(int)lVar32);
            if (0 < pVVar19->nSize) {
              lVar31 = 1;
              lVar30 = 0;
              do {
                lVar1 = lVar30 + 1;
                if (lVar1 < pVVar19->nSize) {
                  piVar13 = pVVar19->pArray;
                  iVar20 = piVar13[lVar30];
                  lVar30 = lVar31;
                  do {
                    iVar26 = pVVar19->pArray[lVar30];
                    bVar6 = iVar26 < iVar20;
                    uVar9 = (uint)*(undefined8 *)pGVar2;
                    iVar24 = iVar20;
                    if ((((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) &&
                        (uVar9 & 0x1fffffff) <
                        ((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) & 0x1fffffff)) == bVar6) {
                      iVar24 = iVar26;
                      iVar26 = iVar20;
                    }
                    uVar9 = Hash_Int2ManInsert(p_01,iVar26,iVar24,
                                               (int)CONCAT71((int7)((ulong)piVar13 >> 8),bVar6));
                    if ((int)uVar9 < 0) goto LAB_006fbdcc;
                    uVar11 = uVar9 * 4;
                    uVar21 = p_01->vObjs->nSize;
                    if (uVar21 == uVar11 ||
                        SBORROW4(uVar21,uVar11) != (int)(uVar21 + uVar9 * -4) < 0)
                    goto LAB_006fbdcc;
                    piVar13 = p_01->vObjs->pArray;
                    iVar26 = piVar13[(ulong)uVar11 + 2];
                    piVar13[(ulong)uVar11 + 2] = iVar26 + 1;
                    if (iVar26 == 1) {
                      uVar11 = (uint)*(undefined8 *)pGVar2;
                      uVar21 = 0;
                      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
                        uVar21 = (uint)((uVar11 & 0x1fffffff) <
                                       ((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) & 0x1fffffff));
                      }
                      iVar10 = iVar10 + 1;
                      local_b4 = local_b4 + uVar21;
                    }
                    Vec_IntPush(p_00,uVar9);
                    if (p_02->nSize <= (int)uVar9) {
                      Vec_IntFillExtra(p_02,(p_02->nSize * 3) / 2,0);
                    }
                    if ((p->vNodLevR->nSize <= lVar32) || (p_02->nSize <= (int)uVar9))
                    goto LAB_006fbdad;
                    iVar26 = p->vNodLevR->pArray[lVar32];
                    piVar13 = p_02->pArray;
                    if (piVar13[uVar9] < iVar26) {
                      piVar13[uVar9] = iVar26;
                    }
                    lVar30 = lVar30 + 1;
                  } while ((int)lVar30 < pVVar19->nSize);
                }
                lVar31 = lVar31 + 1;
                lVar30 = lVar1;
              } while (lVar1 < pVVar19->nSize);
            }
          }
        }
      }
      lVar32 = lVar32 + 1;
      pGVar14 = p->pGia;
      uVar22 = (ulong)pGVar14->nObjs;
    } while (lVar32 < (long)uVar22);
  }
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
    local_50->pArray = (int *)0x0;
  }
  if (local_50 != (Vec_Int_t *)0x0) {
    free(local_50);
  }
  if (local_58->pArray != (int *)0x0) {
    free(local_58->pArray);
    local_58->pArray = (int *)0x0;
  }
  if (local_58 != (Vec_Int_t *)0x0) {
    free(local_58);
  }
  pHVar15 = Hash_IntManStart((iVar10 * 3) / 2);
  p->vHash = pHVar15;
  iVar20 = iVar10 * 2;
  pVVar16 = (Vec_Flt_t *)malloc(0x10);
  iVar26 = 0x10;
  if (0xe < iVar10 * 2 - 1U) {
    iVar26 = iVar20;
  }
  pVVar16->nSize = 0;
  pVVar16->nCap = iVar26;
  lVar32 = (long)iVar26;
  if (iVar26 == 0) {
    pfVar17 = (float *)0x0;
  }
  else {
    pfVar17 = (float *)malloc(lVar32 * 4);
  }
  pVVar16->pArray = pfVar17;
  p->vCounts = pVVar16;
  if (iVar26 == 0) {
    if (pfVar17 == (float *)0x0) {
      pfVar17 = (float *)malloc(0x40);
    }
    else {
      pfVar17 = (float *)realloc(pfVar17,0x40);
    }
    pVVar16->pArray = pfVar17;
    pVVar16->nCap = 0x10;
  }
  pVVar16->nSize = 1;
  *pVVar16->pArray = 1e+09;
  uVar9 = pVVar16->nCap;
  pVVar18 = (Vec_Que_t *)calloc(1,0x20);
  uVar22 = 0x10;
  if (0x10 < (int)uVar9) {
    uVar22 = (ulong)uVar9;
  }
  pVVar18->nSize = 1;
  pVVar18->nCap = (int)uVar22 + 1;
  __size = uVar22 * 4 + 4;
  piVar13 = (int *)malloc(__size);
  memset(piVar13,0xff,__size);
  pVVar18->pHeap = piVar13;
  piVar13 = (int *)malloc(__size);
  memset(piVar13,0xff,__size);
  pVVar18->pOrder = piVar13;
  p->vQue = pVVar18;
  if (pVVar18->pCostsFlt != (float **)0x0) {
    __assert_fail("p->pCostsFlt == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
  }
  pVVar18->pCostsFlt = &pVVar16->pArray;
  pVVar19 = (Vec_Int_t *)malloc(0x10);
  pVVar19->nSize = 0;
  pVVar19->nCap = iVar26;
  if (iVar26 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc(lVar32 * 4);
  }
  pVVar19->pArray = piVar13;
  p->vDiv2Nod = pVVar19;
  Vec_IntPush(pVVar19,1000000000);
  uVar9 = p->pGia->nObjs;
  pVVar19 = (Vec_Int_t *)malloc(0x10);
  if (uVar9 - 1 < 0xf) {
    uVar9 = 0x10;
  }
  pVVar19->nSize = 0;
  pVVar19->nCap = uVar9;
  if (uVar9 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)(int)uVar9 << 2);
  }
  pVVar19->pArray = piVar13;
  p->vNodStore = pVVar19;
  Vec_IntPush(pVVar19,-1);
  pVVar19 = p_01->vObjs;
  iVar24 = pVVar19->nSize;
  iVar27 = iVar24 + 3;
  if (-1 < iVar24) {
    iVar27 = iVar24;
  }
  uVar21 = iVar27 >> 2;
  uVar11 = uVar21 - 1;
  uVar9 = 0x10;
  if (0xe < uVar11) {
    uVar9 = uVar21;
  }
  if (uVar9 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar9 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0xff,(long)(int)uVar21 << 2);
  }
  uVar22 = 0;
  uVar9 = 0;
  if (7 < iVar24) {
    uVar23 = 2;
    if (2 < (int)uVar21) {
      uVar23 = (ulong)uVar21;
    }
    uVar9 = 0;
    uVar29 = 1;
    uVar22 = 0;
    local_48 = uVar23;
    local_40 = __s;
    local_38 = (ulong)uVar21;
    do {
      if ((long)pVVar19->nSize <= (long)(uVar29 * 4)) goto LAB_006fbdcc;
      piVar13 = pVVar19->pArray;
      iVar24 = piVar13[uVar29 * 4 + 2];
      if (1 < iVar24) {
        iVar27 = 0;
        if (piVar13[uVar29 * 4 + 1] < piVar13[uVar29 * 4]) {
          iVar27 = iVar24;
        }
        v = Hash_Int2ManInsert(p->vHash,piVar13[uVar29 * 4],piVar13[uVar29 * 4 + 1],(int)uVar23);
        iVar12 = p->vHash->vObjs->nSize;
        iVar25 = iVar12 + 3;
        if (-1 < iVar12) {
          iVar25 = iVar12;
        }
        if (v != (iVar25 >> 2) + -1) {
          __assert_fail("Num == Hash_IntManEntryNum(p->vHash)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x2af,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        pVVar16 = p->vCounts;
        if (v != pVVar16->nSize) {
          __assert_fail("Num == Vec_FltSize(p->vCounts)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x2b0,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        if ((long)pVVar19->nSize <= (long)(uVar29 * 4)) goto LAB_006fbdcc;
        if ((long)p_02->nSize <= (long)uVar29) goto LAB_006fbdad;
        iVar12 = Dam_ManDivSlack(p,pVVar19->pArray[uVar29 * 4],pVVar19->pArray[uVar29 * 4 + 1],
                                 p_02->pArray[uVar29]);
        uVar4 = pVVar16->nCap;
        if (pVVar16->nSize == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (pVVar16->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc(0x40);
            }
            else {
              pfVar17 = (float *)realloc(pVVar16->pArray,0x40);
            }
            pVVar16->pArray = pfVar17;
            iVar25 = 0x10;
          }
          else {
            iVar25 = uVar4 * 2;
            if (iVar25 <= (int)uVar4) goto LAB_006fb973;
            if (pVVar16->pArray == (float *)0x0) {
              pfVar17 = (float *)malloc((ulong)uVar4 << 3);
            }
            else {
              pfVar17 = (float *)realloc(pVVar16->pArray,(ulong)uVar4 << 3);
            }
            pVVar16->pArray = pfVar17;
          }
          pVVar16->nCap = iVar25;
        }
LAB_006fb973:
        iVar25 = pVVar16->nSize;
        pVVar16->nSize = iVar25 + 1;
        pVVar16->pArray[iVar25] = (float)iVar12 * 0.005 + (float)iVar24;
        Vec_QuePush(p->vQue,v);
        if (v != p->vDiv2Nod->nSize) {
          __assert_fail("Num == Vec_IntSize(p->vDiv2Nod)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x2b4,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        Vec_IntPush(p->vDiv2Nod,p->vNodStore->nSize);
        Vec_IntPush(p->vNodStore,0);
        Vec_IntFillExtra(p->vNodStore,p->vNodStore->nSize + iVar24,-1);
        if (local_38 <= uVar29) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar22 = (ulong)(uint)((int)uVar22 + iVar24);
        uVar9 = uVar9 + iVar27;
        *(int *)((long)local_40 + uVar29 * 4) = v;
        uVar23 = local_48;
        __s = local_40;
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar23);
  }
  iVar24 = p->vHash->vObjs->nSize;
  iVar27 = iVar24 + 3;
  if (-1 < iVar24) {
    iVar27 = iVar24;
  }
  if (p->vCounts->nSize != iVar27 >> 2) {
    __assert_fail("Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,699,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (p->vDiv2Nod->nSize != iVar10 + 1) {
    __assert_fail("Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,700,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (pVVar19->pArray != (int *)0x0) {
    free(pVVar19->pArray);
    pVVar19->pArray = (int *)0x0;
  }
  if (pVVar19 != (Vec_Int_t *)0x0) {
    free(pVVar19);
  }
  pVVar19 = p_01->vTable;
  if (pVVar19->pArray != (int *)0x0) {
    free(pVVar19->pArray);
    pVVar19->pArray = (int *)0x0;
  }
  if (pVVar19 != (Vec_Int_t *)0x0) {
    free(pVVar19);
  }
  free(p_01);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (int *)0x0;
  }
  free(p_02);
  iVar24 = p_00->nSize;
  if (0 < (long)iVar24) {
    piVar13 = p_00->pArray;
    iVar27 = -1;
    lVar30 = 0;
    do {
      iVar12 = piVar13[lVar30];
      if ((long)iVar12 < 0) {
        iVar27 = -iVar12;
      }
      else {
        if ((int)uVar21 <= iVar12) goto LAB_006fbdad;
        uVar4 = *(uint *)((long)__s + (long)iVar12 * 4);
        if ((ulong)uVar4 != 0xffffffff) {
          uVar28 = 0;
          if ((int)uVar4 < p->vDiv2Nod->nSize) {
            if ((int)uVar4 < 0) {
LAB_006fbdad:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar28 = p->vDiv2Nod->pArray[uVar4];
          }
          if (((int)uVar28 < 0) || (p->vNodStore->nSize <= (int)uVar28)) {
LAB_006fbdcc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar3 = p->vNodStore->pArray + uVar28;
          iVar12 = *piVar3;
          *piVar3 = iVar12 + 1;
          piVar3[(long)iVar12 + 1] = iVar27;
        }
      }
      lVar30 = lVar30 + 1;
    } while (iVar24 != lVar30);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pVVar19 = (Vec_Int_t *)malloc(0x10);
  pVVar19->nSize = 0;
  pVVar19->nCap = iVar26;
  if (iVar26 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc(lVar32 << 2);
  }
  pVVar19->pArray = piVar13;
  pVVar19->nSize = iVar20;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,(long)iVar20 << 2);
  }
  p->vDivLevR = pVVar19;
  if (fVerbose != 0) {
    printf("Pairs:");
    iVar20 = 1;
    if (1 < local_cc) {
      iVar20 = local_cc;
    }
    dVar33 = (double)iVar20;
    printf("  Total =%9d (%6.2f %%)",((double)local_cc * 100.0) / dVar33);
    printf("  Tried =%9d (%6.2f %%)",((double)local_b8 * 100.0) / dVar33);
    printf("  Used =%9d (%6.2f %%)",((double)(int)uVar22 * 100.0) / dVar33,uVar22);
    printf("  Xor =%9d (%6.2f %%)",((double)(int)uVar9 * 100.0) / dVar33,(ulong)uVar9);
    putchar(10);
    printf("Div:  ");
    uVar9 = 1;
    if (1 < (int)uVar11) {
      uVar9 = uVar11;
    }
    dVar33 = (double)(int)uVar9;
    printf("  Total =%9d (%6.2f %%)",(ulong)uVar11);
    printf("  Tried =%9d (%6.2f %%)",((double)(int)uVar11 * 100.0) / dVar33,(ulong)uVar11);
    printf("  Used =%9d (%6.2f %%)",((double)iVar10 * 100.0) / dVar33);
    printf("  Xor =%9d (%6.2f %%)",((double)local_b4 * 100.0) / dVar33);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Dam_ManCreatePairs( Dam_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Hash_IntMan_t * vHash;
    Vec_Int_t * vRefsAnd, * vRefsXor, * vSuper, * vDivs, * vRemap, * vLevRMax;
    int i, j, k, Num, FanK, FanJ, nRefs, iNode, iDiv, * pSet;
    int nPairsAll = 0, nPairsTried = 0, nPairsUsed = 0, nPairsXor = 0;
    int nDivsAll = 0, nDivsUsed = 0, nDivsXor = 0;
    Dam_ManCollectSets( p );
    vSuper = p->pGia->vSuper;
    vDivs  = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    vHash  = Hash_IntManStart( Gia_ManObjNum(p->pGia)/2 );
    vLevRMax = Vec_IntStart( 1000 );
    Dam_ManCreateMultiRefs( p, &vRefsAnd, &vRefsXor );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        nPairsAll += pSet[0] * (pSet[0] - 1) / 2;
        Vec_IntClear(vSuper);
        if ( Gia_ObjIsXor(pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsXor, Abc_Lit2Var(pSet[k])) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsAnd, pSet[k]) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else assert( 0 );
        if ( Vec_IntSize(vSuper) < 2 )
            continue;
        // enumerate pairs
        nPairsTried += Vec_IntSize(vSuper) * (Vec_IntSize(vSuper) - 1) / 2;
        Vec_IntPush( vDivs, -i ); // remember node
        Vec_IntForEachEntry( vSuper, FanK, k )
        Vec_IntForEachEntryStart( vSuper, FanJ, j, k+1 )
        {
            if ( (FanK > FanJ) ^ Gia_ObjIsXor(pObj) )
                Num = Hash_Int2ManInsert( vHash, FanJ, FanK, 0 );
            else
                Num = Hash_Int2ManInsert( vHash, FanK, FanJ, 0 );
            if ( Hash_Int2ObjInc( vHash, Num ) == 1 )
            {
                nDivsUsed++;
                nDivsXor += Gia_ObjIsXor(pObj);
            }
            Vec_IntPush( vDivs, Num ); // remember devisor
            // update reverse level
            if ( Num >= Vec_IntSize(vLevRMax) )
                Vec_IntFillExtra( vLevRMax, 3 * Vec_IntSize(vLevRMax) / 2, 0 );
            Vec_IntUpdateEntry( vLevRMax, Num, Vec_IntEntry(p->vNodLevR, i) );
        }
    }
    Vec_IntFree( vRefsAnd );
    Vec_IntFree( vRefsXor );
//    Hash_IntManProfile( vHash );
    // remove entries that appear only once
    p->vHash     = Hash_IntManStart( 3 * nDivsUsed /2 );
    p->vCounts   = Vec_FltAlloc( 2 * nDivsUsed );           Vec_FltPush( p->vCounts, ABC_INFINITY );
    p->vQue      = Vec_QueAlloc( Vec_FltCap(p->vCounts) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // mapping div to node
    p->vDiv2Nod  = Vec_IntAlloc( 2 * nDivsUsed );           Vec_IntPush( p->vDiv2Nod, ABC_INFINITY );
    p->vNodStore = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );  Vec_IntPush( p->vNodStore, -1 );
    nDivsAll     = Hash_IntManEntryNum(vHash);
    vRemap       = Vec_IntStartFull( nDivsAll+1 );
    for ( i = 1; i <= nDivsAll; i++ )
    {
        nRefs = Hash_IntObjData2(vHash, i);
        if ( nRefs < 2 )
            continue;
        nPairsUsed += nRefs;
        if ( Hash_IntObjData0(vHash, i) > Hash_IntObjData1(vHash, i) )
            nPairsXor += nRefs; 
        Num = Hash_Int2ManInsert( p->vHash, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), 0 );
        assert( Num == Hash_IntManEntryNum(p->vHash) );
        assert( Num == Vec_FltSize(p->vCounts) );
        Vec_FltPush( p->vCounts, nRefs + 0.005*Dam_ManDivSlack(p, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), Vec_IntEntry(vLevRMax, i)) );
        Vec_QuePush( p->vQue, Num );
        // remember divisors
        assert( Num == Vec_IntSize(p->vDiv2Nod) );
        Vec_IntPush( p->vDiv2Nod, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        // remember entry
        Vec_IntWriteEntry( vRemap, i, Num );
    }
    assert( Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1 );
    assert( Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1 );
    Hash_IntManStop( vHash );
    Vec_IntFree( vLevRMax );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDiv, i )
    {
        if ( iDiv < 0 )
        {
            iNode = -iDiv;
            continue;
        }
        Num = Vec_IntEntry( vRemap, iDiv );
        if ( Num == -1 )
            continue;
        pSet = Dam_DivSet( p, Num );
        pSet[++pSet[0]] = iNode;
    }
    Vec_IntFree( vRemap );
    Vec_IntFree( vDivs );
    // create storage for reverse level of divisor during update
    p->vDivLevR = Vec_IntStart( 2 * nDivsUsed );
    // make sure divisors are added correctly
//    for ( i = 1; i <= nDivsUsed; i++ )
//        assert( Dam_DivSet(p, i)[0] == Vec_FltEntry(p->vCounts, i)+1 );
    if ( !fVerbose )
        return;
    // print stats
    printf( "Pairs:" );
    printf( "  Total =%9d (%6.2f %%)", nPairsAll,   100.0 * nPairsAll   / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nPairsTried, 100.0 * nPairsTried / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nPairsUsed,  100.0 * nPairsUsed  / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nPairsXor,   100.0 * nPairsXor   / Abc_MaxInt(nPairsAll, 1) );
    printf( "\n" );
    printf( "Div:  " );
    printf( "  Total =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nDivsUsed,   100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nDivsXor,    100.0 * nDivsXor    / Abc_MaxInt(nDivsAll, 1) );
    printf( "\n" );
}